

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

void __thiscall DataRefs::GetWeather(DataRefs *this,float *hPa,string *stationId,string *METAR)

{
  std::recursive_mutex::lock(&mutexDrUpdate);
  *hPa = this->lastWeatherHPA;
  std::__cxx11::string::_M_assign((string *)stationId);
  std::__cxx11::string::_M_assign((string *)METAR);
  pthread_mutex_unlock((pthread_mutex_t *)&mutexDrUpdate);
  return;
}

Assistant:

void DataRefs::GetWeather (float& hPa, std::string& stationId, std::string& METAR)
{
    // protected against reads from the main thread
    std::lock_guard<std::recursive_mutex> lock(mutexDrUpdate);
    
    hPa = lastWeatherHPA;
    stationId = lastWeatherStationId;
    METAR = lastWeatherMETAR;
}